

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_in_out.cpp
# Opt level: O3

OperatorFinalizeResultType
ThrottlingSum::Finalize(ExecutionContext *context,TableFunctionInput *data_p,DataChunk *output)

{
  long lVar1;
  ulong __n;
  reference pvVar2;
  bool bVar3;
  Value local_50 [64];
  
  duckdb::optional_ptr<duckdb::LocalTableFunctionState,_true>::CheckValid
            ((optional_ptr<duckdb::LocalTableFunctionState,_true> *)(data_p + 8));
  lVar1 = *(long *)(data_p + 8);
  __n = *(ulong *)(lVar1 + 0x20);
  bVar3 = (ulong)(*(long *)(lVar1 + 0x10) - *(long *)(lVar1 + 8) >> 2) <= __n;
  if (!bVar3) {
    *(undefined8 *)(output + 0x18) = 1;
    *(ulong *)(lVar1 + 0x20) = __n + 1;
    pvVar2 = duckdb::vector<int,_true>::operator[]((vector<int,_true> *)(lVar1 + 8),__n);
    duckdb::Value::Value(local_50,*pvVar2);
    duckdb::DataChunk::SetValue((ulong)output,0,(Value *)0x0);
    duckdb::Value::~Value(local_50);
  }
  return bVar3;
}

Assistant:

static OperatorFinalizeResultType Finalize(ExecutionContext &context, TableFunctionInput &data_p,
	                                           DataChunk &output) {
		auto &local_state = data_p.local_state->Cast<ThrottlingSum::ThrottlingSumLocalData>();

		if (local_state.current_idx < local_state.row_sums.size()) {
			output.SetCardinality(1);
			output.SetValue(0, 0, Value(local_state.row_sums[local_state.current_idx++]));
			return OperatorFinalizeResultType::HAVE_MORE_OUTPUT;
		} else {
			return OperatorFinalizeResultType::FINISHED;
		}
	}